

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tnt_buf.c
# Opt level: O3

ssize_t tnt_buf_writev(tnt_stream *s,iovec *iov,int count)

{
  long *plVar1;
  ssize_t sVar2;
  void *pvVar3;
  long lVar4;
  
  pvVar3 = s->data;
  sVar2 = -1;
  if (*(int *)((long)pvVar3 + 0x38) != 1) {
    if (count < 1) {
      sVar2 = 0;
      lVar4 = (**(code **)((long)pvVar3 + 0x20))(s,0);
      if (lVar4 == 0) {
        return -1;
      }
    }
    else {
      lVar4 = 0;
      sVar2 = 0;
      do {
        sVar2 = sVar2 + *(long *)((long)&iov->iov_len + lVar4);
        lVar4 = lVar4 + 0x10;
      } while ((ulong)(uint)count << 4 != lVar4);
      pvVar3 = (void *)(**(code **)((long)pvVar3 + 0x20))(s,sVar2);
      if (pvVar3 == (void *)0x0) {
        return -1;
      }
      if (0 < count) {
        lVar4 = 0;
        do {
          memcpy(pvVar3,*(void **)((long)&iov->iov_base + lVar4),
                 *(size_t *)((long)&iov->iov_len + lVar4));
          pvVar3 = (void *)((long)pvVar3 + *(long *)((long)&iov->iov_len + lVar4));
          lVar4 = lVar4 + 0x10;
        } while ((ulong)(uint)count << 4 != lVar4);
      }
    }
    plVar1 = (long *)((long)s->data + 8);
    *plVar1 = *plVar1 + sVar2;
    s->wrcnt = s->wrcnt + 1;
  }
  return sVar2;
}

Assistant:

static ssize_t
tnt_buf_writev(struct tnt_stream *s, struct iovec *iov, int count) {
	if (TNT_SBUF_CAST(s)->as == 1) return -1;
	size_t size = 0;
	int i;
	for (i = 0 ; i < count ; i++)
		size += iov[i].iov_len;
	char *p = TNT_SBUF_CAST(s)->resize(s, size);
	if (p == NULL)
		return -1;
	for (i = 0 ; i < count ; i++) {
		memcpy(p, iov[i].iov_base, iov[i].iov_len);
		p += iov[i].iov_len;
	}
	TNT_SBUF_CAST(s)->size += size;
	s->wrcnt++;
	return size;
}